

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 *
cfd::core::CryptoUtil::HmacSha256(ByteData256 *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr___00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  ByteData *local_20;
  ByteData *data_local;
  ByteData *key_local;
  
  __return_storage_ptr___00 = &local_38;
  local_20 = data;
  data_local = key;
  key_local = (ByteData *)__return_storage_ptr__;
  ByteData::GetBytes(__return_storage_ptr___00,key);
  HmacSha256(__return_storage_ptr__,__return_storage_ptr___00,local_20);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::HmacSha256(const ByteData &key, const ByteData &data) {
  return HmacSha256(key.GetBytes(), data);
}